

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmgen_opna.cpp
# Opt level: O2

void __thiscall FM::OPNBase::SetParameter(OPNBase *this,Channel4 *ch,uint addr,uint data)

{
  uint uVar1;
  uint uVar2;
  
  if (((~addr & 3) != 0) && (uVar2 = addr >> 4 & 0xf, uVar2 - 3 < 7)) {
    uVar1 = *(uint *)((long)SetParameter::slottable + (ulong)(addr & 0xc));
    switch(uVar2) {
    case 3:
      ch->op[uVar1].detune_ = (data & 0x70) * 2;
      ch->op[uVar1].multiple_ = data & 0xf;
      break;
    case 4:
      if ((-1 < (char)(this->super_Timer).regtc) || (this->csmch != ch)) {
        ch->op[uVar1].tl_ = data & 0x7f;
        ch->op[uVar1].param_changed_ = true;
      }
      ch->op[uVar1].tl_latch_ = data & 0x7f;
      return;
    case 5:
      ch->op[uVar1].ks_ = data >> 6 & 3;
      ch->op[uVar1].ar_ = data * 2 & 0x3e;
      break;
    case 6:
      ch->op[uVar1].dr_ = data * 2 & 0x3e;
      ch->op[uVar1].amon_ = (bool)((byte)data >> 7);
      break;
    case 7:
      ch->op[uVar1].sr_ = data * 2 & 0x3e;
      break;
    case 8:
      ch->op[uVar1].sl_ = (uint)""[data >> 4 & 0xf];
      ch->op[uVar1].rr_ = (data & 0xf) * 4 + 2;
      break;
    case 9:
      ch->op[uVar1].ssg_type_ = (int)(data << 0x1c) >> 0x1f & data & 0xf;
      return;
    }
    ch->op[uVar1].param_changed_ = true;
    return;
  }
  return;
}

Assistant:

void OPNBase::SetParameter(Channel4* ch, uint addr, uint data)
{
	const static uint slottable[4] = { 0, 2, 1, 3 };
	const static uint8 sltable[16] =
	{
		  0,   4,   8,  12,  16,  20,  24,  28,
		 32,  36,  40,  44,  48,  52,  56, 124,
	};

	if ((addr & 3) < 3)
	{
		uint slot = slottable[(addr >> 2) & 3];
		Operator* op = &ch->op[slot];

		switch ((addr >> 4) & 15)
		{
		case 3:	// 30-3E DT/MULTI
			op->SetDT((data >> 4) & 0x07);
			op->SetMULTI(data & 0x0f);
			break;

		case 4: // 40-4E TL
			op->SetTL(data & 0x7f, (regtc & 0x80) && (csmch == ch));
			break;

		case 5: // 50-5E KS/AR
			op->SetKS((data >> 6) & 3);
			op->SetAR((data & 0x1f) * 2);
			break;

		case 6: // 60-6E DR/AMON
			op->SetDR((data & 0x1f) * 2);
			op->SetAMON((data & 0x80) != 0);
			break;

		case 7: // 70-7E SR
			op->SetSR((data & 0x1f) * 2);
			break;

		case 8:	// 80-8E SL/RR
			op->SetSL(sltable[(data >> 4) & 15]);
			op->SetRR((data & 0x0f) * 4 + 2);
			break;

		case 9: // 90-9E SSG-EC
			op->SetSSGEC(data & 0x0f);
			break;
		}
	}
}